

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatclient.cpp
# Opt level: O0

void __thiscall ChatClient::login(ChatClient *this,QString *userName)

{
  int iVar1;
  QJsonDocument local_198 [8];
  QByteArray local_190;
  QArrayDataPointer<char16_t> local_178;
  QString local_160;
  QJsonValueRef local_148 [16];
  QJsonValue local_138 [24];
  QArrayDataPointer<char16_t> local_120;
  QString local_108;
  QJsonValueRef local_f0 [16];
  QArrayDataPointer<char16_t> local_e0;
  QString local_c8;
  QJsonValue local_b0 [24];
  QJsonObject local_98 [8];
  QJsonObject message;
  QDataStream local_80 [8];
  QDataStream clientStream;
  QString *userName_local;
  ChatClient *this_local;
  char16_t *str;
  char16_t *str_1;
  char16_t *str_2;
  
  iVar1 = QAbstractSocket::state();
  if (iVar1 == 3) {
    QDataStream::QDataStream(local_80,(QIODevice *)this->m_clientSocket);
    QDataStream::setVersion(local_80,0x11);
    QJsonObject::QJsonObject(local_98);
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_e0,(Data *)0x0,L"login",5);
    QString::QString(&local_c8,&local_e0);
    QJsonValue::QJsonValue(local_b0,(QString *)&local_c8);
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_120,(Data *)0x0,L"type",4);
    QString::QString(&local_108,&local_120);
    local_f0 = (QJsonValueRef  [16])QJsonObject::operator[]((QString *)local_98);
    QJsonValueRef::operator=(local_f0,local_b0);
    QString::~QString(&local_108);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
    QJsonValue::~QJsonValue(local_b0);
    QString::~QString(&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
    QJsonValue::QJsonValue(local_138,(QString *)userName);
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_178,(Data *)0x0,L"username",8);
    QString::QString(&local_160,&local_178);
    local_148 = (QJsonValueRef  [16])QJsonObject::operator[]((QString *)local_98);
    QJsonValueRef::operator=(local_148,local_138);
    QString::~QString(&local_160);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
    QJsonValue::~QJsonValue(local_138);
    QJsonDocument::QJsonDocument(local_198,local_98);
    QJsonDocument::toJson((JsonFormat)&local_190);
    operator<<(local_80,(QByteArray *)&local_190);
    QByteArray::~QByteArray(&local_190);
    QJsonDocument::~QJsonDocument(local_198);
    QJsonObject::~QJsonObject(local_98);
    QDataStream::~QDataStream(local_80);
  }
  return;
}

Assistant:

void ChatClient::login(const QString &userName)
{
    if (m_clientSocket->state() == QAbstractSocket::ConnectedState) { // if the client is connected
        // create a QDataStream operating on the socket
        QDataStream clientStream(m_clientSocket);
        // set the version so that programs compiled with different versions of Qt can agree on how to serialise
        clientStream.setVersion(QDataStream::Qt_5_7);
        // Create the JSON we want to send
        QJsonObject message;
        message[QStringLiteral("type")] = QStringLiteral("login");
        message[QStringLiteral("username")] = userName;
        // send the JSON using QDataStream
        clientStream << QJsonDocument(message).toJson(QJsonDocument::Compact);
    }
}